

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_types.hpp
# Opt level: O2

void __thiscall Satyricon::Literal_Heap::initialize(Literal_Heap *this)

{
  vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_> *this_00;
  pointer pLVar1;
  ulong in_RAX;
  pointer piVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int i;
  ulong uVar6;
  undefined4 uStack_38;
  Literal l;
  
  this_00 = &this->value;
  pLVar1 = (this->value).super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->value).super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>.
      _M_impl.super__Vector_impl_data._M_finish != pLVar1) {
    (this->value).super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>.
    _M_impl.super__Vector_impl_data._M_finish = pLVar1;
  }
  _uStack_38 = in_RAX;
  std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::reserve
            (this_00,(long)(this->map_position).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->map_position).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 2);
  piVar2 = (this->map_position).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar4 = 0;
  iVar5 = 1;
  while( true ) {
    uVar3 = (long)(this->map_position).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar2;
    uVar6 = uVar3 >> 3;
    if ((int)uVar6 <= iVar4) break;
    l.value = iVar5 + -1;
    std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::push_back(this_00,&l);
    (this->map_position).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start[(uint)l.value] =
         (int)((ulong)((long)(this->value).
                             super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->value).
                            super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 2) + -1;
    _uStack_38 = CONCAT44(iVar5,uStack_38);
    std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::push_back(this_00,&l);
    piVar2 = (this->map_position).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar2[_uStack_38 >> 0x20] =
         (int)((ulong)((long)(this->value).
                             super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->value).
                            super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 2) + -1;
    iVar4 = iVar4 + 1;
    iVar5 = iVar5 + 2;
  }
  if ((long)(this->value).
            super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->value).
            super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>._M_impl.
            super__Vector_impl_data._M_start == uVar3) {
    for (; -1 < (int)uVar6; uVar6 = (ulong)((int)uVar6 - 1)) {
      heapify(this,uVar6 & 0xffffffff);
    }
    return;
  }
  __assert_fail("value.size() == map_position.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/GiuMaz[P]satyricon/include/solver_types.hpp"
                ,0xdf,"void Satyricon::Literal_Heap::initialize()");
}

Assistant:

void initialize() {
        value.clear();
        value.reserve(map_position.size());

        for ( int i = 0; i < static_cast<int>(map_position.size()/2); ++i ) {

            Literal l(i,false);
            value.push_back(l);
            map_position[l.index()] = value.size()-1;

            l = Literal(i,true);
            value.push_back(l);
            map_position[l.index()] = value.size()-1;

        }
        assert( value.size() == map_position.size());

        for ( int i = value.size()/2; i >= 0; --i )
            heapify(i);

    }